

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O1

void __thiscall Itemset::print_seq(Itemset *this,ostream *seqstrm,int itempl)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  int *piVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  peVar2 = (this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3 = (peVar2->theArray).
           super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  piVar4 = *(int **)&peVar3->super__Vector_base<int,_std::allocator<int>_>;
  if (*(pointer *)((long)&peVar3->super__Vector_base<int,_std::allocator<int>_> + 8) == piVar4) {
    uVar7 = 0;
    uVar8 = 0;
  }
  else {
    iVar1 = peVar2->theSize;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)seqstrm,*piVar4);
    uVar8 = 1;
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    iVar5 = 1;
    uVar11 = (ulong)(iVar1 - 1U);
    if (2 < iVar1) {
      uVar10 = iVar1 - 2;
      do {
        if (((uint)itempl >> (uVar10 & 0x1f) & 1) != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(seqstrm,"-> ",3);
        }
        peVar3 = (((this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->theArray).
                 super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        lVar9 = *(long *)&peVar3->super__Vector_base<int,_std::allocator<int>_>;
        uVar7 = (long)*(pointer *)((long)&peVar3->super__Vector_base<int,_std::allocator<int>_> + 8)
                - lVar9 >> 2;
        if (uVar7 <= uVar8) goto LAB_001173a7;
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)seqstrm,*(int *)(lVar9 + uVar8 * 4))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        uVar8 = uVar8 + 1;
        uVar10 = uVar10 - 1;
      } while (uVar11 != uVar8);
      iVar5 = (int)uVar8;
    }
    if (((uint)itempl >> ((iVar1 - 1U) - iVar5 & 0x1f) & 1) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(seqstrm,"-> ",3);
    }
    peVar3 = (((this->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             theArray).
             super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    lVar9 = *(long *)&peVar3->super__Vector_base<int,_std::allocator<int>_>;
    uVar7 = (long)*(pointer *)((long)&peVar3->super__Vector_base<int,_std::allocator<int>_> + 8) -
            lVar9 >> 2;
    uVar8 = uVar11;
    if (uVar11 < uVar7) {
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)seqstrm,*(int *)(lVar9 + uVar11 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      std::__ostream_insert<char,std::char_traits<char>>(seqstrm,"-- ",3);
      std::ostream::operator<<((ostream *)seqstrm,this->theSupport);
      if (0 < this->num_class) {
        lVar9 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(seqstrm," ",1);
          std::ostream::operator<<
                    ((ostream *)seqstrm,
                     (this->clsSup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->num_class);
      }
      std::__ostream_insert<char,std::char_traits<char>>(seqstrm," ",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)seqstrm + -0x18) + (char)seqstrm);
      std::ostream::put((char)seqstrm);
      std::ostream::flush();
      return;
    }
  }
LAB_001173a7:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8,uVar7
            );
}

Assistant:

void Itemset::print_seq(ostream& seqstrm, int itempl) {
    int i;
    int sz = size();
    seqstrm << (*theItemset)[0] << " ";
    for (i = 1; i < sz - 1; i++) {
        if (GETBIT(itempl, sz - 1 - i))
            seqstrm << "-> ";
        seqstrm << (*theItemset)[i] << " ";
    }
    if (GETBIT(itempl, sz - 1 - i))
        seqstrm << "-> ";
    seqstrm << (*theItemset)[sz - 1] << " ";
    seqstrm << "-- " << theSupport;
    for (i = 0; i < num_class; i++)
        seqstrm << " " << clsSup[i];
    seqstrm << " ";
//    if (do_print) print_idlist();
    seqstrm << endl;
}